

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O0

int posix_spawn_file_actions_addchdir(posix_spawn_file_actions_t *file_actions,char *path)

{
  int iVar1;
  char *path_local;
  posix_spawn_file_actions_t *file_actions_local;
  
  iVar1 = posix_spawn_file_actions_addchdir_np(file_actions,path);
  return iVar1;
}

Assistant:

static int posix_spawn_file_actions_addchdir(posix_spawn_file_actions_t * __restrict file_actions,
                                             const char * __restrict path) {
#if defined(__GLIBC__) && !__GLIBC_PREREQ(2, 29)
  // Glibc versions prior to 2.29 don't support posix_spawn_file_actions_addchdir_np, impacting:
  //  - Amazon Linux 2 (EoL mid-2025)
  return ENOSYS;
#elif defined(__APPLE__) && defined(__MAC_OS_X_VERSION_MIN_REQUIRED) && __MAC_OS_X_VERSION_MIN_REQUIRED < 101500
  // Conditionally available on macOS if building with a deployment target older than 10.15
  if (__builtin_available(macOS 10.15, *)) {
    return posix_spawn_file_actions_addchdir_np(file_actions, path);
  }
  return ENOSYS;
#elif defined(__OpenBSD__)
  // Currently missing as of:
  //  - OpenBSD 7.5 (April 2024)
  return ENOSYS;
#elif defined(__GLIBC__) || defined(__APPLE__) || defined(__FreeBSD__) || (defined(__ANDROID__) && __ANDROID_API__ >= 34) || defined(__musl__)
  // Pre-standard posix_spawn_file_actions_addchdir_np version available in:
  //  - Solaris 11.3 (October 2015)
  //  - Glibc 2.29 (February 2019)
  //  - macOS 10.15 (October 2019)
  //  - musl 1.1.24 (October 2019)
  //  - FreeBSD 13.1 (May 2022)
  //  - Android 14 (October 2023)
  return posix_spawn_file_actions_addchdir_np((posix_spawn_file_actions_t *)file_actions, path);
#else
  // Standardized posix_spawn_file_actions_addchdir version (POSIX.1-2024, June 2024) available in:
  //  - Solaris 11.4 (August 2018)
  //  - NetBSD 10.0 (March 2024)
  //  - QNX 8 (December 2023)
  return posix_spawn_file_actions_addchdir((posix_spawn_file_actions_t *)file_actions, path);
#endif
}